

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O1

void test_ambiguous(void)

{
  nng_err num;
  char *pcVar1;
  char *pcVar2;
  char *local_48;
  char *av [2];
  char *local_30;
  char *a;
  int opti;
  int v;
  
  a._0_4_ = 1;
  local_30 = (char *)0x0;
  local_48 = "program";
  av[0] = "--fl";
  num = nng_args_parse(2,&local_48,(nng_arg_spec *)&DAT_00154ec0,(int *)((long)&a + 4),&local_30,
                       (int *)&a);
  pcVar1 = nng_strerror(~NNG_ENOMEM);
  acutest_check_((uint)(num == ~NNG_ENOMEM),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x116,"%s fails with %s","nng_args_parse(ac, av, spec, &v, &a, &opti)",pcVar1);
  pcVar1 = nng_strerror(~NNG_ENOMEM);
  pcVar2 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_args_parse(ac, av, spec, &v, &a, &opti)"
                   ,pcVar1,0xfffffffd,pcVar2,(ulong)num);
  return;
}

Assistant:

void
test_ambiguous(void)
{
	int   opti = 1;
	char *av[2];
	int   ac = 2;
	int   v;
	char *a = NULL;

	nng_arg_spec spec[] = {
		{ "flag", 'f', 1, false },
		{ "fluid", 0, 2, false },
		{ NULL, 0, 0, false },
	};

	av[0] = "program";
	av[1] = "--fl";
	NUTS_FAIL(nng_args_parse(ac, av, spec, &v, &a, &opti), NNG_ARG_AMBIG);
}